

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint adler32(uchar *data,uint len)

{
  uint uVar1;
  uint len_local;
  uchar *data_local;
  
  uVar1 = update_adler32(1,data,len);
  return uVar1;
}

Assistant:

static unsigned adler32(const unsigned char* data, unsigned len) {
  return update_adler32(1u, data, len);
}